

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O3

void __thiscall
Imf_2_5::TiledRgbaOutputFile::ToYa::writeTile(ToYa *this,int dx,int dy,int lx,int ly)

{
  bool bVar1;
  long lVar2;
  char *pcVar3;
  ostream *poVar4;
  ArgExc *this_00;
  long lVar5;
  Rgba *rgbaIn;
  undefined1 in_R10B;
  long lVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  Box2i dw;
  FrameBuffer fb;
  stringstream _iex_throw_s;
  ostream local_1a8 [376];
  
  if (this->_fbBase == (Rgba *)0x0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"No frame buffer was specified as the pixel data source for image file \"",
               0x47);
    pcVar3 = TiledOutputFile::fileName(this->_outputFile);
    poVar4 = std::operator<<(local_1a8,pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\".",2);
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(this_00,&_iex_throw_s);
    __cxa_throw(this_00,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
  }
  TiledOutputFile::dataWindowForTile((TiledOutputFile *)&dw,(int)this->_outputFile,dx,dy,lx);
  if (dw.min.y <= dw.max.y) {
    iVar7 = dw.max.x - dw.min.x;
    lVar8 = 0;
    lVar6 = 0;
    lVar9 = (long)dw.min.y;
    do {
      if (dw.min.x <= dw.max.x) {
        lVar5 = 0;
        lVar2 = (long)dw.min.x;
        do {
          *(Rgba *)((long)&(((this->_buf)._data)->r)._h + lVar5 + (this->_buf)._sizeY * lVar8) =
               this->_fbBase[this->_fbXStride * lVar2 + this->_fbYStride * lVar9];
          lVar5 = lVar5 + 8;
          bVar1 = lVar2 < dw.max.x;
          lVar2 = lVar2 + 1;
        } while (bVar1);
      }
      rgbaIn = (this->_buf)._data + (this->_buf)._sizeY * lVar6;
      RgbaYca::RGBAtoYCA(&this->_yw,iVar7 + 1,this->_writeA,rgbaIn,rgbaIn);
      lVar6 = lVar6 + 1;
      lVar8 = lVar8 + 8;
      bVar1 = lVar9 < dw.max.y;
      lVar9 = lVar9 + 1;
    } while (bVar1);
  }
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Slice::Slice((Slice *)&_iex_throw_s,HALF,
               (char *)&(this->_buf)._data[(long)-dw.min.y * (this->_buf)._sizeY + (long)-dw.min.x].
                        g,8,(ulong)this->_tileXSize << 3,1,1,0.0,(bool)in_R10B,false);
  FrameBuffer::insert(&fb,"Y",(Slice *)&_iex_throw_s);
  Slice::Slice((Slice *)&_iex_throw_s,HALF,
               (char *)&(this->_buf)._data[-(long)dw.min.y * (this->_buf)._sizeY - (long)dw.min.x].a
               ,8,(ulong)this->_tileXSize << 3,1,1,0.0,(bool)in_R10B,false);
  FrameBuffer::insert(&fb,"A",(Slice *)&_iex_throw_s);
  TiledOutputFile::setFrameBuffer(this->_outputFile,&fb);
  TiledOutputFile::writeTile(this->_outputFile,dx,dy,lx,ly);
  std::
  _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
               *)&fb);
  return;
}

Assistant:

void
TiledRgbaOutputFile::ToYa::writeTile (int dx, int dy, int lx, int ly)
{
    if (_fbBase == 0)
    {
	THROW (IEX_NAMESPACE::ArgExc, "No frame buffer was specified as the "
			    "pixel data source for image file "
			    "\"" << _outputFile.fileName() << "\".");
    }

    //
    // Copy the tile's RGBA pixels into _buf and convert
    // them to luminance/alpha format
    //

    Box2i dw = _outputFile.dataWindowForTile (dx, dy, lx, ly);
    int width = dw.max.x - dw.min.x + 1;

    for (int y = dw.min.y, y1 = 0; y <= dw.max.y; ++y, ++y1)
    {
	for (int x = dw.min.x, x1 = 0; x <= dw.max.x; ++x, ++x1)
	    _buf[y1][x1] = _fbBase[x * _fbXStride + y * _fbYStride];

	RGBAtoYCA (_yw, width, _writeA, _buf[y1], _buf[y1]);
    }

    //
    // Store the contents of _buf in the output file
    //

    FrameBuffer fb;

    fb.insert ("Y", Slice (HALF,				   // type
			   (char *) &_buf[-dw.min.y][-dw.min.x].g, // base
			   sizeof (Rgba),			   // xStride
			   sizeof (Rgba) * _tileXSize));	   // yStride

    fb.insert ("A", Slice (HALF,				   // type
			   (char *) &_buf[-dw.min.y][-dw.min.x].a, // base
			   sizeof (Rgba),			   // xStride
			   sizeof (Rgba) * _tileXSize));	   // yStride

    _outputFile.setFrameBuffer (fb);
    _outputFile.writeTile (dx, dy, lx, ly);
}